

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkFromNdr(void *pData)

{
  Wlc_Obj_t *pWVar1;
  byte bVar2;
  char cVar3;
  uchar uVar4;
  uchar *puVar5;
  Wlc_Obj_t *pWVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  Wlc_Ntk_t *pWVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  uint *puVar13;
  void *pvVar14;
  long lVar15;
  char *pcVar16;
  Abc_Nam_t *pAVar17;
  Wlc_Ntk_t *pWVar18;
  Vec_Wrd_t *pVVar19;
  word *__s;
  int iVar20;
  ulong uVar21;
  int Ent_2;
  ulong uVar22;
  int Ent;
  uint uVar23;
  long lVar24;
  int Ent_1;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  Vec_Int_t *pVVar30;
  int Ent_3;
  int iVar31;
  uint *puVar32;
  bool bVar33;
  int fFound;
  int End;
  int local_ac;
  Vec_Int_t *local_a8;
  Wlc_Ntk_t *local_a0;
  int *local_98;
  uint local_8c;
  Ndr_Data_t *local_88;
  Vec_Int_t *local_80;
  ulong local_78;
  ulong local_70;
  uint local_68 [8];
  uint local_48;
  int local_44;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(400);
  pVVar9->pArray = piVar10;
  iVar20 = *(int *)(*(long *)((long)pData + 0x10) + 8) + 2;
  iVar25 = 1;
  if (3 < iVar20) {
    iVar26 = 3;
    iVar25 = 0;
    do {
      bVar2 = *(byte *)(*(long *)((long)pData + 8) + (long)iVar26);
      if (bVar2 == 0) goto LAB_003664e2;
      iVar27 = 1;
      if (bVar2 < 4) {
        iVar27 = *(int *)(*(long *)((long)pData + 0x10) + (long)iVar26 * 4);
      }
      iVar25 = iVar25 + (uint)(bVar2 == 3);
      iVar26 = iVar26 + iVar27;
    } while (iVar26 < iVar20);
    iVar25 = iVar25 + 1;
  }
  pWVar11 = Wlc_NtkAlloc("top",iVar25);
  Wlc_NtkCheckIntegrity(pData);
  (pWVar11->vFfs).nSize = 0;
  uVar23 = pWVar11->nObjsAlloc;
  if ((pWVar11->vNameIds).nCap < (int)uVar23) {
    piVar10 = (pWVar11->vNameIds).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar23 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar23 << 2);
    }
    (pWVar11->vNameIds).pArray = piVar10;
    if (piVar10 == (int *)0x0) goto LAB_003665bb;
    (pWVar11->vNameIds).nCap = uVar23;
  }
  if (0 < (int)uVar23) {
    memset((pWVar11->vNameIds).pArray,0,(ulong)uVar23 * 4);
  }
  (pWVar11->vNameIds).nSize = uVar23;
  lVar15 = *(long *)((long)pData + 0x10);
  local_a0 = pWVar11;
  if (3 < *(int *)(lVar15 + 8) + 2) {
    iVar20 = 3;
    do {
      lVar24 = (long)iVar20;
      cVar3 = *(char *)(*(long *)((long)pData + 8) + lVar24);
      if (cVar3 == '\x03') {
        iVar25 = iVar20 + 1;
        for (iVar26 = iVar25; iVar26 < *(int *)(lVar15 + lVar24 * 4) + iVar20;
            iVar26 = iVar26 + iVar27) {
          lVar28 = (long)iVar26;
          bVar2 = *(byte *)(*(long *)((long)pData + 8) + lVar28);
          if (bVar2 == 6) {
            if (*(int *)(lVar15 + lVar28 * 4) != 3) goto LAB_0036555a;
            break;
          }
          if (bVar2 == 0) goto LAB_003664e2;
          iVar27 = 1;
          if (bVar2 < 4) {
            iVar27 = *(int *)(lVar15 + lVar28 * 4);
          }
        }
        iVar26 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar20,(int *)local_68,&local_ac);
        uVar23 = Wlc_ObjAlloc(local_a0,1,iVar26,local_68[0],local_ac);
        lVar15 = *(long *)((long)pData + 0x10);
        iVar27 = *(int *)(lVar15 + lVar24 * 4) + iVar20;
        iVar26 = -1;
        if (iVar25 < iVar27) {
          do {
            lVar28 = (long)iVar25;
            bVar2 = *(byte *)(*(long *)((long)pData + 8) + lVar28);
            if (bVar2 == 5) {
              iVar26 = *(int *)(lVar15 + lVar28 * 4);
              break;
            }
            if (bVar2 == 0) goto LAB_003664e2;
            iVar29 = 1;
            if (bVar2 < 4) {
              iVar29 = *(int *)(lVar15 + lVar28 * 4);
            }
            iVar25 = iVar25 + iVar29;
          } while (iVar25 < iVar27);
        }
        if (((int)uVar23 < 0) || ((local_a0->vNameIds).nSize <= (int)uVar23)) goto LAB_00366520;
        (local_a0->vNameIds).pArray[uVar23] = iVar26;
      }
      else if (cVar3 == '\0') goto LAB_003664e2;
LAB_0036555a:
      bVar2 = *(byte *)(*(long *)((long)pData + 8) + lVar24);
      if (bVar2 == 0) goto LAB_003664e2;
      iVar25 = 1;
      if (bVar2 < 4) {
        iVar25 = *(int *)(*(long *)((long)pData + 0x10) + lVar24 * 4);
      }
      iVar20 = iVar20 + iVar25;
      lVar15 = *(long *)((long)pData + 0x10);
    } while (iVar20 < *(int *)(lVar15 + 8) + 2);
  }
  puVar13 = *(uint **)((long)pData + 0x10);
  local_88 = (Ndr_Data_t *)pData;
  local_80 = pVVar9;
  if ((int)(puVar13[2] + 2) < 4) {
    local_98 = (int *)0x0;
LAB_00365d7a:
    puVar13 = ((Ndr_Data_t *)pData)->pBody;
    if (3 < (int)(puVar13[2] + 2)) {
      iVar20 = 3;
      do {
        uVar4 = ((Ndr_Data_t *)pData)->pHead[iVar20];
        if (uVar4 == '\x03') {
          iVar25 = iVar20 + 1;
          for (iVar26 = iVar25; iVar26 < (int)(puVar13[iVar20] + iVar20); iVar26 = iVar26 + uVar23)
          {
            bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar26];
            if (bVar2 == 6) {
              if (puVar13[iVar26] != 4) goto LAB_00365f93;
              break;
            }
            if (bVar2 == 0) goto LAB_003664e2;
            uVar23 = 1;
            if (bVar2 < 4) {
              uVar23 = puVar13[iVar26];
            }
          }
          iVar26 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar20,(int *)local_68,&local_ac);
          puVar13 = ((Ndr_Data_t *)pData)->pBody;
          uVar23 = 0;
          if (iVar25 < (int)(puVar13[iVar20] + iVar20)) {
            puVar32 = (uint *)0x0;
            iVar27 = iVar25;
            do {
              bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar27];
              if (bVar2 == 4) {
                uVar23 = uVar23 + 1;
                if (puVar32 == (uint *)0x0) {
                  puVar32 = puVar13 + iVar27;
                }
              }
              else {
                if (bVar2 == 0) goto LAB_003664e2;
                if (puVar32 != (uint *)0x0) break;
              }
              uVar7 = 1;
              if (bVar2 < 4) {
                uVar7 = puVar13[iVar27];
              }
              iVar27 = iVar27 + uVar7;
            } while (iVar27 < (int)(puVar13[iVar20] + iVar20));
            uVar23 = (uint)(uVar23 == 1);
          }
          else {
            puVar32 = (uint *)0x0;
          }
          uVar7 = Wlc_ObjAlloc(local_a0,7,iVar26,local_68[0],local_ac);
          pVVar9 = local_80;
          puVar13 = ((Ndr_Data_t *)pData)->pBody;
          bVar33 = true;
          if (iVar25 < (int)(puVar13[iVar20] + iVar20)) {
            do {
              bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar25];
              if (bVar2 == 5) {
                bVar33 = puVar13[iVar25] == 0xffffffff;
                break;
              }
              if (bVar2 == 0) goto LAB_003664e2;
              uVar8 = 1;
              if (bVar2 < 4) {
                uVar8 = puVar13[iVar25];
              }
              iVar25 = iVar25 + uVar8;
            } while (iVar25 < (int)(puVar13[iVar20] + iVar20));
          }
          if (((byte)uVar23 & bVar33) == 0) {
            __assert_fail("nArray == 1 && NameId == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0x1bf,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
          }
          if (((int)uVar7 < 1) || (local_a0->nObjsAlloc <= (int)uVar7)) goto LAB_00366501;
          uVar23 = *puVar32;
          pWVar6 = local_a0->pObjs;
          if (local_80->nCap < 1) {
            if (local_80->pArray == (int *)0x0) {
              piVar10 = (int *)malloc(4);
            }
            else {
              piVar10 = (int *)realloc(local_80->pArray,4);
            }
            pVVar9->pArray = piVar10;
            if (piVar10 == (int *)0x0) goto LAB_003665bb;
            pVVar9->nCap = 1;
          }
          pWVar11 = local_a0;
          *pVVar9->pArray = uVar23;
          pVVar9->nSize = 1;
          Wlc_ObjAddFanins(local_a0,pWVar6 + uVar7,pVVar9);
          Wlc_ObjSetCo(pWVar11,pWVar6 + uVar7,0);
          pData = local_88;
        }
        else if (uVar4 == '\0') {
LAB_003664e2:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
LAB_00365f93:
        if (((Ndr_Data_t *)pData)->pHead[iVar20] == 0) goto LAB_003664e2;
        uVar23 = 1;
        if (((Ndr_Data_t *)pData)->pHead[iVar20] < 4) {
          uVar23 = ((Ndr_Data_t *)pData)->pBody[iVar20];
        }
        iVar20 = iVar20 + uVar23;
        puVar13 = ((Ndr_Data_t *)pData)->pBody;
      } while (iVar20 < (int)(puVar13[2] + 2));
    }
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (int *)0x0;
    }
    free(pVVar9);
    puVar13 = (uint *)malloc(0x10);
    puVar13[0] = 0;
    puVar13[1] = 0;
    puVar13[2] = 0;
    puVar13[3] = 0;
    uVar23 = (local_a0->vNameIds).nSize;
    if ((ulong)uVar23 != 0) {
      piVar10 = (local_a0->vNameIds).pArray;
      iVar20 = *piVar10;
      if (1 < (int)uVar23) {
        uVar21 = 1;
        do {
          if (iVar20 <= piVar10[uVar21]) {
            iVar20 = piVar10[uVar21];
          }
          uVar21 = uVar21 + 1;
        } while (uVar23 != uVar21);
      }
      uVar23 = iVar20 + 1;
      if (-1 < iVar20) {
        pvVar14 = malloc((ulong)uVar23 << 2);
        *(void **)(puVar13 + 2) = pvVar14;
        if (pvVar14 == (void *)0x0) {
LAB_003665bb:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *puVar13 = uVar23;
        memset(pvVar14,0,(ulong)uVar23 << 2);
      }
      puVar13[1] = uVar23;
      if (0 < (local_a0->vNameIds).nSize) {
        lVar15 = 0;
        do {
          uVar23 = piVar10[lVar15];
          if ((ulong)uVar23 != 0) {
            if (((int)uVar23 < 0) || (iVar20 < (int)uVar23)) {
LAB_00366520:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)(*(long *)(puVar13 + 2) + (ulong)uVar23 * 4) = (int)lVar15;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (local_a0->vNameIds).nSize);
      }
    }
    pWVar11 = local_a0;
    if (1 < local_a0->iObj) {
      lVar15 = 1;
      do {
        if (local_a0->nObjsAlloc <= lVar15) goto LAB_00366501;
        pWVar6 = local_a0->pObjs + lVar15;
        if ((pWVar6->nFanins < 3) &&
           ((undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x2f) !=
            (undefined1  [24])0x6)) {
          paVar12 = &pWVar6->field_10;
        }
        else {
          paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar6->field_10).pFanins[0];
        }
        if (0 < (int)pWVar6->nFanins) {
          lVar24 = 0;
          do {
            iVar20 = paVar12->Fanins[lVar24];
            if (((long)iVar20 < 0) || ((int)puVar13[1] <= iVar20)) goto LAB_003664c3;
            paVar12->Fanins[lVar24] = *(int *)(*(long *)(puVar13 + 2) + (long)iVar20 * 4);
            lVar24 = lVar24 + 1;
          } while (lVar24 < (int)pWVar6->nFanins);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < local_a0->iObj);
    }
    pVVar9 = local_a0->vInits;
    if (pVVar9 != (Vec_Int_t *)0x0) {
      if (0 < (local_a0->vFfs).nSize) {
        piVar10 = (local_a0->vFfs).pArray;
        lVar15 = 0;
        do {
          iVar20 = piVar10[lVar15];
          if (((long)iVar20 < 0) || ((int)puVar13[1] <= iVar20)) goto LAB_003664c3;
          piVar10[lVar15] = *(int *)(*(long *)(puVar13 + 2) + (long)iVar20 * 4);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (local_a0->vFfs).nSize);
      }
      iVar20 = pVVar9->nSize;
      if (0 < iVar20) {
        piVar10 = pVVar9->pArray;
        lVar15 = 0;
        do {
          iVar20 = piVar10[lVar15];
          if (0 < (long)iVar20) {
            if ((int)puVar13[1] <= iVar20) goto LAB_003664c3;
            piVar10[lVar15] = *(int *)(*(long *)(puVar13 + 2) + (long)iVar20 * 4);
          }
          lVar15 = lVar15 + 1;
          iVar20 = pVVar9->nSize;
        } while (lVar15 < iVar20);
      }
      uVar23 = (local_a0->vFfs).nSize;
      if ((uVar23 & 1) != 0) {
        __assert_fail("(Vec_IntSize(&pNtk->vFfs) & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                      ,0x1d6,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
      }
      if (uVar23 != iVar20 * 2) {
        __assert_fail("Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                      ,0x1d7,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
      }
      if (0 < (local_a0->vFfs).nSize) {
        uVar21 = 0;
        do {
          if ((long)(pWVar11->vFfs).nSize <= (long)uVar21) goto LAB_003664c3;
          iVar20 = (pWVar11->vFfs).pArray[uVar21];
          if (((long)iVar20 < 1) || (pWVar11->nObjsAlloc <= iVar20)) goto LAB_00366501;
          if ((uVar21 & 1) != 0) {
            Wlc_ObjSetCo(pWVar11,pWVar11->pObjs + iVar20,1);
          }
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)(pWVar11->vFfs).nSize);
      }
      (pWVar11->vFfs).nSize = 0;
      pcVar16 = Wlc_PrsConvertInitValues(pWVar11);
      pWVar11->pInits = pcVar16;
    }
    if (*(void **)(puVar13 + 2) != (void *)0x0) {
      free(*(void **)(puVar13 + 2));
      puVar13[2] = 0;
      puVar13[3] = 0;
    }
    if (puVar13 != (uint *)0x0) {
      free(puVar13);
    }
    uVar23 = (pWVar11->vNameIds).nSize;
    if ((ulong)uVar23 == 0) {
      uVar7 = 0;
    }
    else {
      puVar13 = (uint *)(pWVar11->vNameIds).pArray;
      uVar7 = *puVar13;
      if (1 < (int)uVar23) {
        uVar21 = 1;
        do {
          uVar8 = puVar13[uVar21];
          if ((int)uVar7 <= (int)uVar8) {
            uVar7 = uVar8;
          }
          uVar21 = uVar21 + 1;
        } while (uVar23 != uVar21);
      }
    }
    uVar23 = uVar7 + 1;
    uVar21 = (ulong)uVar23;
    if ((1 < uVar23) && (uVar21 = 0, uVar7 != 0)) {
      uVar22 = (ulong)uVar7;
      do {
        uVar8 = (uint)uVar22;
        uVar22 = uVar22 / 10;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (9 < uVar8);
    }
    pAVar17 = Abc_NamStart(uVar23,10);
    pWVar11->pManName = pAVar17;
    if (0 < (int)uVar7) {
      uVar23 = 1;
      do {
        sprintf((char *)local_68,"s%0*d",uVar21,(ulong)uVar23);
        uVar8 = Abc_NamStrFindOrAdd(local_a0->pManName,(char *)local_68,&local_ac);
        if ((local_ac != 0) || (uVar23 != uVar8)) {
          __assert_fail("!fFound && i == NameId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x1ec,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        bVar33 = uVar23 != uVar7;
        uVar23 = uVar23 + 1;
      } while (bVar33);
    }
    pWVar11 = local_a0;
    pWVar18 = Wlc_NtkDupDfs(local_a0,0,1);
    Wlc_NtkFree(pWVar11);
    piVar10 = local_98;
    if (local_98 != (int *)0x0) {
      iVar20 = pWVar18->iObj;
      pVVar19 = (Vec_Wrd_t *)malloc(0x10);
      iVar25 = 0x10;
      if (0xe < iVar20 - 1U) {
        iVar25 = iVar20;
      }
      pVVar19->nSize = 0;
      pVVar19->nCap = iVar25;
      if (iVar25 == 0) {
        __s = (word *)0x0;
      }
      else {
        __s = (word *)malloc((long)iVar25 << 3);
      }
      pVVar19->pArray = __s;
      pVVar19->nSize = iVar20;
      memset(__s,0,(long)iVar20 * 8);
      pWVar18->vLutTruths = pVVar19;
      iVar25 = pWVar18->iObj;
      if (1 < (long)iVar25) {
        uVar21 = 1;
        if (1 < pWVar18->nObjsAlloc) {
          uVar21 = (ulong)(uint)pWVar18->nObjsAlloc;
        }
        uVar22 = 1;
        lVar15 = 3;
        do {
          if (uVar21 == uVar22) {
LAB_00366501:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          if ((long)(pWVar18->vNameIds).nSize <= (long)uVar22) {
LAB_003664c3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((*(ushort *)(&pWVar18->pObjs->field_0x0 + lVar15 * 8) & 0x3f) == 0x3b) {
            uVar23 = (pWVar18->vNameIds).pArray[uVar22];
            if (uVar23 != 0) {
              if (((int)uVar23 < 0) || (piVar10[1] <= (int)uVar23)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              if ((long)iVar20 <= (long)uVar22) {
LAB_0036659c:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
              }
              __s[uVar22] = *(word *)(*(long *)(piVar10 + 2) + (ulong)uVar23 * 8);
            }
          }
          uVar22 = uVar22 + 1;
          lVar15 = lVar15 + 3;
        } while ((long)iVar25 != uVar22);
      }
      if (*(void **)(piVar10 + 2) != (void *)0x0) {
        free(*(void **)(piVar10 + 2));
        piVar10[2] = 0;
        piVar10[3] = 0;
      }
      free(piVar10);
    }
    pWVar18->fMemPorts = 1;
    pWVar18->fEasyFfs = 1;
    return pWVar18;
  }
  pVVar30 = &local_a0->vFfs;
  local_38 = &local_a0->vFfs2;
  iVar20 = 3;
  local_98 = (int *)0x0;
LAB_003655e1:
  puVar5 = ((Ndr_Data_t *)pData)->pHead;
  if (puVar5[iVar20] != '\x03') {
    if (puVar5[iVar20] != '\0') goto LAB_00365c05;
    goto LAB_003664e2;
  }
  iVar25 = iVar20 + 1;
  iVar26 = puVar13[iVar20] + iVar20;
  if (iVar25 < iVar26) {
    local_a8 = (Vec_Int_t *)CONCAT44(local_a8._4_4_,iVar25);
    iVar27 = iVar25;
    do {
      bVar2 = puVar5[iVar27];
      if (bVar2 == 6) {
        if ((iVar25 < iVar26) && (puVar13[iVar27] != 3)) goto LAB_00365662;
        break;
      }
      if (bVar2 == 0) goto LAB_003664e2;
      uVar23 = 1;
      if (bVar2 < 4) {
        uVar23 = puVar13[iVar27];
      }
      iVar27 = iVar27 + uVar23;
    } while (iVar27 < iVar26);
  }
LAB_00365c05:
  if (((Ndr_Data_t *)pData)->pHead[iVar20] == 0) goto LAB_003664e2;
  uVar23 = 1;
  if (((Ndr_Data_t *)pData)->pHead[iVar20] < 4) {
    uVar23 = ((Ndr_Data_t *)pData)->pBody[iVar20];
  }
  iVar20 = iVar20 + uVar23;
  puVar13 = ((Ndr_Data_t *)pData)->pBody;
  if ((int)(puVar13[2] + 2) <= iVar20) goto LAB_00365d7a;
  goto LAB_003655e1;
  while( true ) {
    if (bVar2 == 0) goto LAB_003664e2;
    uVar23 = 1;
    if (bVar2 < 4) {
      uVar23 = puVar13[iVar25];
    }
    iVar25 = iVar25 + uVar23;
    if (iVar26 <= iVar25) break;
LAB_00365662:
    bVar2 = puVar5[iVar25];
    if (bVar2 == 6) {
      if (puVar13[iVar25] != 4) {
        local_40 = pVVar30;
        iVar25 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar20,(int *)local_68,&local_ac);
        puVar13 = ((Ndr_Data_t *)pData)->pBody;
        iVar26 = puVar13[iVar20] + iVar20;
        uVar21 = 0xffffffff;
        if (iVar26 <= (int)local_a8) goto LAB_00365709;
        iVar27 = (int)local_a8;
        goto LAB_003656d1;
      }
      break;
    }
  }
  goto LAB_00365c05;
  while( true ) {
    if (bVar2 == 0) goto LAB_003664e2;
    uVar23 = 1;
    if (bVar2 < 4) {
      uVar23 = puVar13[iVar27];
    }
    iVar27 = iVar27 + uVar23;
    if (iVar26 <= iVar27) break;
LAB_003656d1:
    bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar27];
    if (bVar2 == 6) {
      uVar21 = (ulong)puVar13[iVar27];
      break;
    }
  }
LAB_00365709:
  if ((int)local_a8 < iVar26) {
    puVar32 = (uint *)0x0;
    uVar23 = 0;
    iVar27 = (int)local_a8;
    do {
      bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar27];
      if (bVar2 == 4) {
        uVar23 = uVar23 + 1;
        if (puVar32 == (uint *)0x0) {
          puVar32 = puVar13 + iVar27;
        }
      }
      else {
        if (bVar2 == 0) goto LAB_003664e2;
        if (puVar32 != (uint *)0x0) break;
      }
      uVar7 = 1;
      if (bVar2 < 4) {
        uVar7 = puVar13[iVar27];
      }
      iVar27 = iVar27 + uVar7;
    } while (iVar27 < iVar26);
  }
  else {
    puVar32 = (uint *)0x0;
    uVar23 = 0;
  }
  local_70 = uVar21;
  iVar26 = Ndr_TypeNdr2Wlc((int)uVar21);
  local_48 = local_68[0];
  local_44 = local_ac;
  local_8c = Wlc_ObjAlloc(local_a0,iVar26,iVar25,local_68[0],local_ac);
  pVVar9 = local_80;
  puVar13 = ((Ndr_Data_t *)pData)->pBody;
  local_78 = 0xffffffff;
  if ((int)local_a8 < (int)(puVar13[iVar20] + iVar20)) {
    iVar25 = (int)local_a8;
    do {
      bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar25];
      if (bVar2 == 5) {
        local_78 = (ulong)puVar13[iVar25];
        break;
      }
      if (bVar2 == 0) goto LAB_003664e2;
      uVar7 = 1;
      if (bVar2 < 4) {
        uVar7 = puVar13[iVar25];
      }
      iVar25 = iVar25 + uVar7;
    } while (iVar25 < (int)(puVar13[iVar20] + iVar20));
  }
  local_80->nSize = 0;
  if (0 < (int)uVar23) {
    uVar21 = 0;
    do {
      Vec_IntPush(pVVar9,puVar32[uVar21]);
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  pVVar9 = local_80;
  pData = local_88;
  uVar23 = local_8c;
  pWVar11 = local_a0;
  iVar25 = (int)local_70;
  switch(iVar25) {
  case 0x58:
    if (local_a0->vInits == (Vec_Int_t *)0x0) {
      local_a8 = (Vec_Int_t *)malloc(0x10);
      local_a8->nCap = 100;
      local_a8->nSize = 0;
      piVar10 = (int *)malloc(400);
      local_a8->pArray = piVar10;
      pWVar11->vInits = local_a8;
    }
    pVVar30 = pWVar11->vInits;
    if (pVVar9->nSize == 2) {
      pVVar9->nSize = 1;
      iVar25 = pVVar9->pArray[1];
    }
    else {
      iVar25 = local_44 + ~local_48;
    }
    Vec_IntPush(pVVar30,iVar25);
    pVVar30 = local_40;
    if (((int)uVar23 < 1) || (pWVar11->nObjsAlloc <= (int)uVar23)) goto LAB_00366501;
    if ((undefined1  [24])((undefined1  [24])pWVar11->pObjs[uVar23] & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x3) {
      __assert_fail("Wlc_ObjType(pObj) == WLC_OBJ_FO",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x196,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    if ((pWVar11->vNameIds).nSize <= (int)uVar23) goto LAB_00366520;
    (pWVar11->vNameIds).pArray[uVar23] = (int)local_78;
    Vec_IntPush(local_40,(int)local_78);
    if (pVVar9->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x19a,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    Vec_IntPush(pVVar30,*pVVar9->pArray);
    goto LAB_00365c05;
  case 0x59:
    Vec_IntPush(local_38,local_8c);
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    pData = local_88;
    break;
  case 0x5b:
LAB_003659ef:
    uVar23 = local_8c;
    iVar25 = local_ac;
    Vec_IntPush(pVVar9,local_68[0]);
    pWVar11 = local_a0;
    Vec_IntPush(pVVar9,iVar25);
    break;
  case 0x61:
LAB_00365980:
    uVar23 = local_8c;
    puVar13 = ((Ndr_Data_t *)pData)->pBody;
    if ((int)local_a8 < (int)(puVar13[iVar20] + iVar20)) {
      iVar25 = (int)local_a8;
      do {
        bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar25];
        if (bVar2 == 9) {
          puVar13 = puVar13 + iVar25;
          goto LAB_00365ad7;
        }
        if (bVar2 == 0) goto LAB_003664e2;
        uVar7 = 1;
        if (bVar2 < 4) {
          uVar7 = puVar13[iVar25];
        }
        iVar25 = iVar25 + uVar7;
      } while (iVar25 < (int)(puVar13[iVar20] + iVar20));
    }
    puVar13 = (uint *)0x0;
LAB_00365ad7:
    Ndr_ObjReadConstant(pVVar9,(char *)puVar13);
    break;
  default:
    if (iVar25 == 0x15) {
LAB_00365a1a:
      uVar23 = local_8c;
      if (pVVar9->nSize == 3) {
        piVar10 = pVVar9->pArray;
        iVar25 = piVar10[1];
        piVar10[1] = piVar10[2];
        if (pVVar9->nSize < 3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar10[2] = iVar25;
      }
    }
    else if (iVar25 == 0x4b) {
      iVar25 = 0x4b;
      piVar10 = local_98;
      if (local_98 == (int *)0x0) {
        piVar10 = (int *)malloc(0x10);
        piVar10[0] = 1000;
        piVar10[1] = 0;
        pvVar14 = malloc(8000);
        *(void **)(piVar10 + 2) = pvVar14;
        piVar10[1] = 1000;
        memset(pvVar14,0,8000);
        iVar25 = (int)local_70;
      }
      iVar26 = (int)local_a8;
      local_98 = piVar10;
      if ((piVar10[1] <= (int)local_78) && (iVar27 = (int)local_78 * 2, piVar10[1] < iVar27)) {
        iVar29 = *piVar10;
        iVar31 = iVar29 * 2;
        if (iVar31 < iVar27) {
          if (iVar29 < iVar27) {
            if (*(void **)(piVar10 + 2) == (void *)0x0) {
              pvVar14 = malloc((long)iVar27 << 3);
            }
            else {
              pvVar14 = realloc(*(void **)(piVar10 + 2),(long)iVar27 << 3);
            }
            *(void **)(local_98 + 2) = pvVar14;
            iVar31 = iVar27;
LAB_00365c97:
            iVar25 = (int)local_70;
            if (pvVar14 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            *local_98 = iVar31;
            iVar26 = (int)local_a8;
          }
        }
        else if (iVar29 < iVar31 && iVar29 < iVar27) {
          if (*(void **)(piVar10 + 2) == (void *)0x0) {
            pvVar14 = malloc((long)iVar29 << 4);
          }
          else {
            pvVar14 = realloc(*(void **)(piVar10 + 2),(long)iVar29 << 4);
          }
          *(void **)(local_98 + 2) = pvVar14;
          goto LAB_00365c97;
        }
        piVar10 = local_98;
        uVar23 = local_98[1];
        if ((int)uVar23 < iVar27) {
          memset((void *)((long)(int)uVar23 * 8 + *(long *)(local_98 + 2)),0,
                 (ulong)(~uVar23 + iVar27) * 8 + 8);
          iVar25 = (int)local_70;
          iVar26 = (int)local_a8;
        }
        piVar10[1] = iVar27;
        pVVar9 = local_80;
      }
      while( true ) {
        bVar2 = ((Ndr_Data_t *)pData)->pHead[iVar26];
        if (bVar2 == 9) break;
        if (bVar2 == 0) goto LAB_003664e2;
        uVar23 = 1;
        if (bVar2 < 4) {
          uVar23 = ((Ndr_Data_t *)pData)->pBody[iVar26];
        }
        iVar26 = iVar26 + uVar23;
      }
      if (((int)local_78 < 0) || (local_98[1] <= (int)local_78)) goto LAB_0036659c;
      *(undefined8 *)(*(long *)(local_98 + 2) + (local_78 & 0xffffffff) * 8) =
           *(undefined8 *)(((Ndr_Data_t *)pData)->pBody + iVar26);
      if (iVar25 == 0x15) goto LAB_00365a1a;
      if (iVar25 == 0x61) {
        goto LAB_00365980;
      }
      uVar23 = local_8c;
      if (iVar25 == 0x5b) goto LAB_003659ef;
    }
  }
  if (((int)uVar23 < 1) || (pWVar11->nObjsAlloc <= (int)uVar23)) goto LAB_00366501;
  Wlc_ObjAddFanins(pWVar11,pWVar11->pObjs + uVar23,local_80);
  if ((pWVar11->vNameIds).nSize <= (int)local_8c) goto LAB_00366520;
  (pWVar11->vNameIds).pArray[uVar23] = (int)local_78;
  pVVar30 = local_40;
  pVVar9 = local_80;
  if ((int)local_70 == 0x35) {
    if (pWVar11->nObjsAlloc <= (int)local_8c) goto LAB_00366501;
    pWVar6 = pWVar11->pObjs;
    if (pWVar6[uVar23].nFanins != 2) {
      __assert_fail("Wlc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x1b3,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    pWVar1 = pWVar6 + uVar23;
    paVar12 = &pWVar1->field_10;
    if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
        (undefined1  [24])0x6) {
      paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
    }
    iVar25 = paVar12->Fanins[0];
    if (((long)iVar25 < 1) || (pWVar11->nObjsAlloc <= iVar25)) goto LAB_00366501;
    *(byte *)(pWVar6 + iVar25) = *(byte *)(pWVar6 + iVar25) | 0x40;
    paVar12 = &pWVar1->field_10;
    if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
        (undefined1  [24])0x6) {
      paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
    }
    iVar25 = paVar12->Fanins[1];
    if (((long)iVar25 < 1) || (pWVar11->nObjsAlloc <= iVar25)) goto LAB_00366501;
    *(ushort *)(pWVar11->pObjs + iVar25) = *(ushort *)(pWVar11->pObjs + iVar25) | 0x40;
  }
  goto LAB_00365c05;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Wlc_Obj_t * pObj; Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    int Mod = 2, i, k, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Vec_Wrd_t * vTruths = NULL;
    Wlc_Ntk_t * pTemp, * pNtk = Wlc_NtkAlloc( "top", Ndr_DataObjNum(p, Mod)+1 );
    Wlc_NtkCheckIntegrity( pData );
    Vec_IntClear( &pNtk->vFfs );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wlc_NtkCleanNameId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wlc_ObjAlloc( pNtk, Ndr_TypeNdr2Wlc(Type), Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        if ( Type == ABC_OPER_DFF )
        {
            // save init state
            if ( pNtk->vInits == NULL )
                pNtk->vInits = Vec_IntAlloc( 100 );
            if ( Vec_IntSize(vFanins) == 2 )
                Vec_IntPush( pNtk->vInits, Vec_IntPop(vFanins) );
            else // assume const0 if init is not given
                Vec_IntPush( pNtk->vInits, -(End-Beg+1) );
            // save flop output
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjType(pObj) == WLC_OBJ_FO );
            Wlc_ObjSetNameId( pNtk, iObj, NameId );
            Vec_IntPush( &pNtk->vFfs, NameId );
            // save flop input
            assert( Vec_IntSize(vFanins) == 1 );
            Vec_IntPush( &pNtk->vFfs, Vec_IntEntry(vFanins, 0) );
            continue;
        }
        if ( Type == ABC_OPER_DFFRSE )
            Vec_IntPush( &pNtk->vFfs2, iObj );
        if ( Type == ABC_OPER_LUT )
        {
            if ( vTruths == NULL )
                vTruths = Vec_WrdStart( 1000 );
            if ( NameId >= Vec_WrdSize(vTruths) )
                Vec_WrdFillExtra( vTruths, 2*NameId, 0 );
            Vec_WrdWriteEntry( vTruths, NameId, *((word *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION)) );
        }
        if ( Type == ABC_OPER_SLICE )
            Vec_IntPushTwo( vFanins, End, Beg );
        else if ( Type == ABC_OPER_CONST )
            Ndr_ObjReadConstant( vFanins, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
            ABC_SWAP( int, Vec_IntEntryP(vFanins, 1)[0], Vec_IntEntryP(vFanins, 2)[0] );
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjFaninNum(pObj) == 2 );
            Wlc_ObjFanin0(pNtk, pObj)->Signed = 1;
            Wlc_ObjFanin1(pNtk, pObj)->Signed = 1;
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wlc_ObjAlloc( pNtk, WLC_OBJ_BUF, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        assert( nArray == 1 && NameId == -1 );
        pObj = Wlc_NtkObj( pNtk, iObj );
        Vec_IntFill( vFanins, 1, pArray[0] );
        Wlc_ObjAddFanins( pNtk, pObj, vFanins );
        Wlc_ObjSetCo( pNtk, pObj, 0 );
    }
    Vec_IntFree( vFanins );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            pFanins[k] = Vec_IntEntry(vName2Obj, pFanins[k]);
    }
    if ( pNtk->vInits )
    {
        Vec_IntForEachEntry( &pNtk->vFfs, NameId, i )
            Vec_IntWriteEntry( &pNtk->vFfs, i, Vec_IntEntry(vName2Obj, NameId) );
        Vec_IntForEachEntry( pNtk->vInits, NameId, i )
            if ( NameId > 0 )
                Vec_IntWriteEntry( pNtk->vInits, i, Vec_IntEntry(vName2Obj, NameId) );
        // move FO/FI to be part of CI/CO
        assert( (Vec_IntSize(&pNtk->vFfs) & 1) == 0 );
        assert( Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits) );
        Wlc_NtkForEachFf( pNtk, pObj, i )
            if ( i & 1 )
                Wlc_ObjSetCo( pNtk, pObj, 1 );
            //else
            //    Wlc_ObjSetCi( pNtk, pObj );
        Vec_IntClear( &pNtk->vFfs );
        // convert init values into binary string
        //Vec_IntPrint( &p->pNtk->vInits );
        pNtk->pInits = Wlc_PrsConvertInitValues( pNtk );
        //printf( "%s", p->pNtk->pInits );
    }
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    //Ndr_NtkPrintNodes( pNtk );
    //Wlc_WriteVer( pNtk, "temp_ndr.v", 0, 0 );
    // derive topological order
    pNtk = Wlc_NtkDupDfs( pTemp = pNtk, 0, 1 );
    Wlc_NtkFree( pTemp );
    // copy truth tables
    if ( vTruths )
    {
        pNtk->vLutTruths = Vec_WrdStart( Wlc_NtkObjNumMax(pNtk) );
        Wlc_NtkForEachObj( pNtk, pObj, i )
        {
            int iObj   = Wlc_ObjId(pNtk, pObj);
            int NameId = Wlc_ObjNameId(pNtk, iObj);
            word Truth;
            if ( pObj->Type != WLC_OBJ_LUT || NameId == 0 )
                continue;
            Truth = Vec_WrdEntry(vTruths, NameId);
            assert( sizeof(void *) == 8 || Wlc_ObjFaninNum(pObj) < 6 );
            Vec_WrdWriteEntry( pNtk->vLutTruths, iObj, Truth );
        }
        Vec_WrdFreeP( &vTruths );
    }
    //Ndr_NtkPrintNodes( pNtk );
    pNtk->fMemPorts = 1;          // the network contains memory ports
    pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}